

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  undefined8 *puVar1;
  int iVar2;
  pointer pBVar3;
  int *piVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  int iVar8;
  undefined4 extraout_var;
  Layer *pLVar9;
  undefined4 extraout_var_00;
  size_t sVar10;
  Mat *pMVar11;
  int iVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  size_t *psVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  int local_400;
  int local_3fc;
  Layer *local_3f8;
  Mat *local_3f0;
  long local_3e8;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  ulong local_3d0;
  Net *local_3c8;
  DataReader *local_3c0;
  vector<int,_std::allocator<int>_> *local_3b8;
  int local_3ac;
  ParamDict local_3a8;
  string *local_398;
  vector<int,_std::allocator<int>_> *local_390;
  Mat local_388;
  long local_340;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_3ac = 0;
  iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar8 == 1) {
    if (local_3ac == 0x7685dd) {
      local_3d4 = 0;
      local_3d8 = 0;
      iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar8 == 1) {
        iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3d8);
        if (iVar8 == 1) {
          if ((0 < (long)local_3d4) && (0 < local_3d8)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_3d4);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_3d8);
            ParamDict::ParamDict(&local_3a8);
            if (0 < local_3d4) {
              local_3e8 = 0;
              local_3d0 = 0;
              local_3c8 = this;
              local_3c0 = dr;
              do {
                psVar17 = &local_338[0].elemsize;
                local_3fc = 0;
                local_400 = 0;
                iVar8 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_238);
                if (iVar8 != 1) {
                  load_param();
LAB_0016e2cf:
                  iVar8 = -1;
                  goto LAB_0016e2d4;
                }
                iVar8 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_138);
                if (iVar8 != 1) {
                  load_param();
                  goto LAB_0016e2cf;
                }
                iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3fc);
                if (iVar8 != 1) {
                  load_param();
                  goto LAB_0016e2cf;
                }
                iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_400);
                if (iVar8 != 1) {
                  load_param();
                  goto LAB_0016e2cf;
                }
                iVar8 = (*this->_vptr_Net[4])(this,local_238);
                pLVar9 = (Layer *)CONCAT44(extraout_var,iVar8);
                if ((pLVar9 == (Layer *)0x0) &&
                   (pLVar9 = create_layer(local_238), pLVar9 == (Layer *)0x0)) {
                  iVar8 = (*this->_vptr_Net[3])(this,local_238);
                  pLVar9 = (Layer *)CONCAT44(extraout_var_00,iVar8);
                  if (pLVar9 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered",local_238);
                    fputc(10,_stderr);
                    clear(this);
                    goto LAB_0016e2cf;
                  }
                }
                local_3f8 = pLVar9;
                local_338[0].data = psVar17;
                sVar10 = strlen(local_238);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_238,local_238 + sVar10);
                std::__cxx11::string::operator=((string *)&local_3f8->type,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar17) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_338[0].data = psVar17;
                sVar10 = strlen(local_138);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_138,local_138 + sVar10);
                pLVar9 = local_3f8;
                local_398 = &local_3f8->name;
                std::__cxx11::string::operator=((string *)local_398,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar17) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_390 = &pLVar9->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_390,(long)local_3fc);
                if (0 < local_3fc) {
                  lVar19 = 0;
                  do {
                    iVar8 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_338);
                    if (iVar8 != 1) {
                      load_param();
                      goto LAB_0016e2cf;
                    }
                    iVar8 = find_blob_index_by_name(this,(char *)local_338);
                    if (iVar8 == -1) {
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_388.data = &local_388.elemsize;
                      sVar10 = strlen((char *)local_338);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_388,local_338,(long)&local_338[0].data + sVar10);
                      lVar18 = (long)(int)local_3d0;
                      std::__cxx11::string::operator=
                                ((string *)(pBVar3 + lVar18),(string *)&local_388);
                      if ((size_t *)local_388.data != &local_388.elemsize) {
                        operator_delete(local_388.data,
                                        CONCAT44(local_388.elemsize._4_4_,
                                                 (undefined4)local_388.elemsize) + 1);
                      }
                      iVar8 = (int)local_3d0;
                      local_3d0 = (ulong)(iVar8 + 1);
                      this = local_3c8;
                    }
                    else {
                      lVar18 = (long)iVar8;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar18].consumer = (int)local_3e8;
                    (local_390->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = iVar8;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < local_3fc);
                }
                pLVar9 = local_3f8;
                local_3b8 = &local_3f8->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_3b8,(long)local_400);
                if (0 < local_400) {
                  lVar18 = (long)(int)local_3d0 * 0x70;
                  local_3f0 = (Mat *)(local_3d0 & 0xffffffff);
                  lVar19 = 0;
                  do {
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar8 = (*local_3c0->_vptr_DataReader[2])(local_3c0,"%255s",local_338);
                    if (iVar8 != 1) {
                      load_param();
                      goto LAB_0016e2cf;
                    }
                    local_388.data = &local_388.elemsize;
                    sVar10 = strlen((char *)local_338);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_388,local_338,(long)&local_338[0].data + sVar10);
                    std::__cxx11::string::operator=
                              ((string *)((long)&(pBVar3->name)._M_dataplus._M_p + lVar18),
                               (string *)&local_388);
                    if ((size_t *)local_388.data != &local_388.elemsize) {
                      operator_delete(local_388.data,
                                      CONCAT44(local_388.elemsize._4_4_,
                                               (undefined4)local_388.elemsize) + 1);
                    }
                    *(int *)((long)&pBVar3->producer + lVar18) = (int)local_3e8;
                    (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = (int)local_3f0 + (int)lVar19;
                    lVar19 = lVar19 + 1;
                    lVar18 = lVar18 + 0x70;
                    this = local_3c8;
                  } while (lVar19 < local_400);
                  local_3d0 = (ulong)(uint)((int)local_3d0 + (int)lVar19);
                  pLVar9 = local_3f8;
                  dr = local_3c0;
                }
                iVar8 = ParamDict::load_param(&local_3a8,dr);
                if (iVar8 == 0) {
                  if (pLVar9->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  local_388.cstep = 0;
                  local_388.data = (size_t *)0x0;
                  local_388.refcount._0_4_ = 0;
                  local_388.refcount._4_4_ = 0;
                  local_388.elemsize._0_4_ = 0;
                  local_388.elemsize._4_4_ = 0;
                  local_388.elempack = 0;
                  local_388.h = 0;
                  local_388.d = 0;
                  local_388.c = 0;
                  local_388.allocator = (Allocator *)0x0;
                  local_388.dims = 0;
                  local_388.w = 0;
                  ParamDict::get(local_338,&local_3a8,0x1e,&local_388);
                  piVar16 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      if (local_388.allocator == (Allocator *)0x0) {
                        if ((size_t *)local_388.data != (size_t *)0x0) {
                          free(local_388.data);
                        }
                      }
                      else {
                        (*(local_388.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                      ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_400)) {
                    piVar16 = (int *)((long)local_338[0].data + 0xc);
                    lVar19 = 0;
                    do {
                      iVar8 = (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar3 = (local_3c8->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar2 = piVar16[-3];
                      if (iVar2 == 3) {
                        iVar12 = piVar16[-2];
                        lVar18 = (long)piVar16[-1];
                        iVar15 = *piVar16;
                        sVar20 = lVar18 * iVar12 + 3U & 0x3ffffffffffffffc;
                        pMVar11 = &pBVar3[iVar8].shape;
                        piVar4 = pBVar3[iVar8].shape.refcount;
                        iVar14 = 3;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            pvVar13 = pBVar3[iVar8].shape.data;
                            pAVar5 = pBVar3[iVar8].shape.allocator;
                            if (pAVar5 == (Allocator *)0x0) {
LAB_0016ded7:
                              pMVar11 = &pBVar3[iVar8].shape;
                              if (pvVar13 != (void *)0x0) {
                                local_3f0 = &pBVar3[iVar8].shape;
                                local_3dc = iVar15;
                                local_340 = lVar18;
                                free(pvVar13);
                                pMVar11 = local_3f0;
                                lVar18 = local_340;
                                iVar15 = local_3dc;
                                iVar14 = iVar2;
                              }
                            }
                            else {
                              local_3f0 = pMVar11;
                              local_3dc = iVar15;
                              (*pAVar5->_vptr_Allocator[3])();
                              iVar14 = 3;
                              pMVar11 = local_3f0;
                              iVar15 = local_3dc;
                            }
                          }
                        }
LAB_0016df0b:
                        pMVar11->data = (void *)0x0;
                        pMVar11->refcount = (int *)0x0;
                        pBVar3[iVar8].shape.elemsize = 4;
                        pBVar3[iVar8].shape.elempack = 1;
                        pBVar3[iVar8].shape.allocator = (Allocator *)0x0;
                        pBVar3[iVar8].shape.dims = iVar14;
                        pBVar3[iVar8].shape.w = iVar12;
                        pBVar3[iVar8].shape.h = (int)lVar18;
                        pBVar3[iVar8].shape.d = 1;
                        pBVar3[iVar8].shape.c = iVar15;
                        pBVar3[iVar8].shape.cstep = sVar20;
                        pLVar9 = local_3f8;
                      }
                      else {
                        if (iVar2 == 2) {
                          iVar12 = piVar16[-2];
                          lVar18 = (long)piVar16[-1];
                          sVar20 = lVar18 * iVar12;
                          pMVar11 = &pBVar3[iVar8].shape;
                          piVar4 = pBVar3[iVar8].shape.refcount;
                          iVar15 = 1;
                          iVar14 = 2;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar13 = pBVar3[iVar8].shape.data;
                              pAVar5 = pBVar3[iVar8].shape.allocator;
                              if (pAVar5 == (Allocator *)0x0) goto LAB_0016ded7;
                              local_3f0 = pMVar11;
                              (*pAVar5->_vptr_Allocator[3])();
                              iVar14 = 2;
                              pMVar11 = local_3f0;
                              iVar15 = 1;
                            }
                          }
                          goto LAB_0016df0b;
                        }
                        if (iVar2 == 1) {
                          iVar12 = piVar16[-2];
                          sVar20 = (size_t)iVar12;
                          piVar4 = pBVar3[iVar8].shape.refcount;
                          iVar14 = 1;
                          pMVar11 = &pBVar3[iVar8].shape;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar13 = pBVar3[iVar8].shape.data;
                              pAVar5 = pBVar3[iVar8].shape.allocator;
                              if (pAVar5 == (Allocator *)0x0) {
                                lVar18 = 1;
                                iVar15 = 1;
                                goto LAB_0016ded7;
                              }
                              (*pAVar5->_vptr_Allocator[3])();
                              lVar18 = 1;
                              iVar15 = 1;
                              iVar14 = 1;
                              goto LAB_0016df0b;
                            }
                          }
                          lVar18 = 1;
                          iVar15 = 1;
                          goto LAB_0016df0b;
                        }
                      }
                      lVar19 = lVar19 + 1;
                      piVar16 = piVar16 + 4;
                    } while (lVar19 < local_400);
                  }
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (&pLVar9->bottom_shapes,(long)local_3fc);
                  if (0 < local_3fc) {
                    lVar19 = 0;
                    lVar18 = 0;
                    iVar8 = local_3fc;
                    do {
                      iVar2 = (local_390->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar18];
                      pBVar3 = (local_3c8->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar6 = (pLVar9->bottom_shapes).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar6->data + lVar19);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar16 = pBVar3[iVar2].shape.refcount;
                        if (piVar16 != (int *)0x0) {
                          LOCK();
                          *piVar16 = *piVar16 + 1;
                          UNLOCK();
                        }
                        piVar16 = *(int **)((long)&pMVar6->refcount + lVar19);
                        if (piVar16 != (int *)0x0) {
                          LOCK();
                          *piVar16 = *piVar16 + -1;
                          UNLOCK();
                          if (*piVar16 == 0) {
                            pvVar13 = *(void **)((long)&pMVar6->data + lVar19);
                            plVar7 = *(long **)((long)&pMVar6->allocator + lVar19);
                            if (plVar7 == (long *)0x0) {
                              if (pvVar13 != (void *)0x0) {
                                free(pvVar13);
                              }
                            }
                            else {
                              (**(code **)(*plVar7 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar6->cstep + lVar19) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar19);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar6->c + lVar19) = 0;
                        piVar16 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar6->data + lVar19);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar16;
                        *(size_t *)((long)&pMVar6->elemsize + lVar19) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar6->elempack + lVar19) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar6->allocator + lVar19) =
                             pBVar3[iVar2].shape.allocator;
                        iVar8 = pBVar3[iVar2].shape.w;
                        iVar12 = pBVar3[iVar2].shape.h;
                        iVar15 = pBVar3[iVar2].shape.d;
                        piVar16 = (int *)((long)&pMVar6->dims + lVar19);
                        *piVar16 = pBVar3[iVar2].shape.dims;
                        piVar16[1] = iVar8;
                        piVar16[2] = iVar12;
                        piVar16[3] = iVar15;
                        *(int *)((long)&pMVar6->c + lVar19) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar6->cstep + lVar19) = pBVar3[iVar2].shape.cstep;
                        iVar8 = local_3fc;
                      }
                      lVar18 = lVar18 + 1;
                      lVar19 = lVar19 + 0x48;
                    } while (lVar18 < iVar8);
                  }
                  this = local_3c8;
                  this_00 = &local_3f8->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (this_00,(long)local_400);
                  if (0 < local_400) {
                    lVar18 = 0;
                    lVar19 = 0;
                    iVar8 = local_400;
                    do {
                      iVar2 = (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar6 = (this_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar6->data + lVar18);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar16 = pBVar3[iVar2].shape.refcount;
                        if (piVar16 != (int *)0x0) {
                          LOCK();
                          *piVar16 = *piVar16 + 1;
                          UNLOCK();
                        }
                        piVar16 = *(int **)((long)&pMVar6->refcount + lVar18);
                        if (piVar16 != (int *)0x0) {
                          LOCK();
                          *piVar16 = *piVar16 + -1;
                          UNLOCK();
                          if (*piVar16 == 0) {
                            pvVar13 = *(void **)((long)&pMVar6->data + lVar18);
                            plVar7 = *(long **)((long)&pMVar6->allocator + lVar18);
                            if (plVar7 == (long *)0x0) {
                              if (pvVar13 != (void *)0x0) {
                                free(pvVar13);
                              }
                            }
                            else {
                              (**(code **)(*plVar7 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar6->cstep + lVar18) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar18);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar6->c + lVar18) = 0;
                        piVar16 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar6->data + lVar18);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar16;
                        *(size_t *)((long)&pMVar6->elemsize + lVar18) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar6->elempack + lVar18) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar6->allocator + lVar18) =
                             pBVar3[iVar2].shape.allocator;
                        iVar8 = pBVar3[iVar2].shape.w;
                        iVar12 = pBVar3[iVar2].shape.h;
                        iVar15 = pBVar3[iVar2].shape.d;
                        piVar16 = (int *)((long)&pMVar6->dims + lVar18);
                        *piVar16 = pBVar3[iVar2].shape.dims;
                        piVar16[1] = iVar8;
                        piVar16[2] = iVar12;
                        piVar16[3] = iVar15;
                        *(int *)((long)&pMVar6->c + lVar18) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar6->cstep + lVar18) = pBVar3[iVar2].shape.cstep;
                        iVar8 = local_400;
                      }
                      lVar19 = lVar19 + 1;
                      lVar18 = lVar18 + 0x48;
                      this = local_3c8;
                    } while (lVar19 < iVar8);
                  }
                  iVar8 = ParamDict::get(&local_3a8,0x1f,0);
                  pLVar9 = local_3f8;
                  local_3f8->featmask = iVar8;
                  iVar8 = (*local_3f8->_vptr_Layer[2])(local_3f8,&local_3a8);
                  dr = local_3c0;
                  if (iVar8 == 0) {
                    (this->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_3e8] = pLVar9;
                    iVar8 = 0;
                  }
                  else {
                    load_param();
                    iVar8 = 0xe;
                  }
                  if (local_338[0].refcount != (int *)0x0) {
                    LOCK();
                    *local_338[0].refcount = *local_338[0].refcount + -1;
                    UNLOCK();
                    if (*local_338[0].refcount == 0) {
                      if (local_338[0].allocator == (Allocator *)0x0) {
                        if ((size_t *)local_338[0].data != (size_t *)0x0) {
                          free(local_338[0].data);
                        }
                      }
                      else {
                        (*(local_338[0].allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar8 != 0xe) && (iVar8 != 0)) goto LAB_0016e2cf;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",local_3e8,
                          (local_398->_M_dataplus)._M_p);
                  fputc(10,_stderr);
                }
                local_3e8 = local_3e8 + 1;
              } while (local_3e8 < local_3d4);
            }
            NetPrivate::update_input_output_indexes(this->d);
            iVar8 = 0;
            NetPrivate::update_input_output_names(this->d);
LAB_0016e2d4:
            ParamDict::~ParamDict(&local_3a8);
            return iVar8;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
        if (!layer)
        {
            layer = create_layer(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}